

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_solver.cpp
# Opt level: O0

void test_1(string *out_dir)

{
  ChStreamOutAscii *pCVar1;
  MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *pMVar2;
  DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *pDVar3;
  Matrix<double,_1,_1,1,_1,_1> *pMVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  undefined8 uVar7;
  double dVar8;
  ChVectorRef local_c60;
  ChVectorRef local_c48;
  ChVectorRef local_c30;
  ChVectorRef local_c18;
  ChException *myex;
  ChStreamOutAsciiFile fileCq;
  ChStreamOutAscii local_928 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  ChStreamOutAsciiFile local_8e8 [8];
  ChStreamOutAsciiFile fileM;
  ChStreamOutAscii local_618 [32];
  undefined1 local_5f8 [8];
  string filename;
  ChSparseMatrix matrCq;
  ChSparseMatrix matrM;
  double max_LCPerr;
  double max_res;
  ChSolverPSOR solver;
  ChSolver local_510 [168];
  ChRowVectorRef local_468;
  ChRowVectorRef local_448;
  ChRowVectorRef local_428;
  ChRowVectorRef local_408;
  ChRowVectorRef local_3e8;
  ChRowVectorRef local_3c8;
  ChConstraintTwoGeneric local_3a8 [8];
  ChConstraintTwoGeneric mcb;
  ChRowVectorRef local_310;
  ChRowVectorRef local_2f0;
  ChRowVectorRef local_2d0;
  ChRowVectorRef local_2b0;
  ChRowVectorRef local_290;
  ChRowVectorRef local_270;
  ChConstraintTwoGeneric local_250 [8];
  ChConstraintTwoGeneric mca;
  XprTypeNested local_1b8;
  Scalar local_1b0;
  undefined1 local_1a8 [8];
  ChVariablesGeneric mvarB;
  ChVectorRef local_138;
  ChVectorRef local_120;
  XprTypeNested local_108;
  Scalar local_100;
  undefined1 local_f8 [8];
  ChVariablesGeneric mvarA;
  ChSystemDescriptor local_78 [8];
  ChSystemDescriptor mdescriptor;
  string *out_dir_local;
  
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar1,"\n-------------------------------------------------\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"TEST: generic system with two constraints \n\n");
  chrono::ChSystemDescriptor::ChSystemDescriptor(local_78);
  chrono::ChSystemDescriptor::BeginInsertion(local_78);
  chrono::ChVariablesGeneric::ChVariablesGeneric((ChVariablesGeneric *)local_f8,3);
  pMVar2 = (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
           chrono::ChVariablesGeneric::GetMass((ChVariablesGeneric *)local_f8);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setIdentity(pMVar2);
  local_100 = 10.0;
  pDVar3 = (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
           chrono::ChVariablesGeneric::GetMass((ChVariablesGeneric *)local_f8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::operator*=(pDVar3,&local_100);
  pMVar2 = (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
           chrono::ChVariablesGeneric::GetMass((ChVariablesGeneric *)local_f8);
  local_108 = (XprTypeNested)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::inverse(pMVar2);
  pMVar4 = (Matrix<double,_1,_1,1,_1,_1> *)
           chrono::ChVariablesGeneric::GetInvMass((ChVariablesGeneric *)local_f8);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::operator=
            (pMVar4,(DenseBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_> *)
                    &local_108);
  chrono::ChVariables::Get_fb(&local_120,(ChVariables *)local_f8);
  pSVar5 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_120,0);
  *pSVar5 = 1.0;
  chrono::ChVariables::Get_fb(&local_138,(ChVariables *)local_f8);
  pSVar5 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_138,1);
  *pSVar5 = 2.0;
  chrono::ChVariablesGeneric::ChVariablesGeneric((ChVariablesGeneric *)local_1a8,3);
  pMVar2 = (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
           chrono::ChVariablesGeneric::GetMass((ChVariablesGeneric *)local_1a8);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setIdentity(pMVar2);
  local_1b0 = 20.0;
  pDVar3 = (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
           chrono::ChVariablesGeneric::GetMass((ChVariablesGeneric *)local_1a8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::operator*=(pDVar3,&local_1b0);
  pMVar2 = (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
           chrono::ChVariablesGeneric::GetMass((ChVariablesGeneric *)local_1a8);
  local_1b8 = (XprTypeNested)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::inverse(pMVar2);
  pMVar4 = (Matrix<double,_1,_1,1,_1,_1> *)
           chrono::ChVariablesGeneric::GetInvMass((ChVariablesGeneric *)local_1a8);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::operator=
            (pMVar4,(DenseBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_> *)
                    &local_1b8);
  chrono::ChSystemDescriptor::InsertVariables(local_78,(ChVariables *)local_f8);
  chrono::ChSystemDescriptor::InsertVariables(local_78,(ChVariables *)local_1a8);
  chrono::ChConstraintTwoGeneric::ChConstraintTwoGeneric
            (local_250,(ChVariables *)local_f8,(ChVariables *)local_1a8);
  chrono::ChConstraint::Set_b_i((ChConstraint *)local_250,-5.0);
  chrono::ChConstraintTwoGeneric::Get_Cq_a(&local_270,local_250);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_270,0);
  *pSVar6 = 1.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_a(&local_290,local_250);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_290,1);
  *pSVar6 = 2.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_a(&local_2b0,local_250);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_2b0,2);
  *pSVar6 = -1.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b(&local_2d0,local_250);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_2d0,0);
  *pSVar6 = 1.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b(&local_2f0,local_250);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_2f0,1);
  *pSVar6 = -2.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b(&local_310,local_250);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_310,2);
  *pSVar6 = 0.0;
  chrono::ChConstraintTwoGeneric::ChConstraintTwoGeneric
            (local_3a8,(ChVariables *)local_f8,(ChVariables *)local_1a8);
  chrono::ChConstraint::Set_b_i((ChConstraint *)local_3a8,1.0);
  chrono::ChConstraintTwoGeneric::Get_Cq_a(&local_3c8,local_3a8);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_3c8,0);
  *pSVar6 = 0.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_a(&local_3e8,local_3a8);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_3e8,1);
  *pSVar6 = 1.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_a(&local_408,local_3a8);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_408,2);
  *pSVar6 = 0.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b(&local_428,local_3a8);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_428,0);
  *pSVar6 = 0.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b(&local_448,local_3a8);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_448,1);
  *pSVar6 = -2.0;
  chrono::ChConstraintTwoGeneric::Get_Cq_b(&local_468,local_3a8);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)&local_468,2);
  *pSVar6 = 0.0;
  chrono::ChSystemDescriptor::InsertConstraint(local_78,(ChConstraint *)local_250);
  chrono::ChSystemDescriptor::InsertConstraint(local_78,(ChConstraint *)local_3a8);
  chrono::ChSystemDescriptor::EndInsertion(local_78);
  chrono::ChSolverPSOR::ChSolverPSOR((ChSolverPSOR *)&max_res);
  chrono::ChIterativeSolver::SetMaxIterations((ChIterativeSolver *)&max_res,1);
  chrono::ChIterativeSolver::EnableWarmStart((ChIterativeSolver *)&max_res,false);
  chrono::ChIterativeSolver::SetTolerance((ChIterativeSolver *)&max_res,0.0);
  chrono::ChIterativeSolverVI::SetOmega(0.8);
  chrono::ChSolver::Setup(local_510,local_78);
  chrono::ChSolverPSOR::Solve((ChSystemDescriptor *)&max_res);
  chrono::ChSystemDescriptor::ComputeFeasabilityViolation((double *)local_78,&max_LCPerr);
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix
            ((SparseMatrix<double,_1,_int> *)&matrCq.m_data.m_allocatedSize);
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix
            ((SparseMatrix<double,_1,_int> *)((long)&filename.field_2 + 8));
  chrono::ChSystemDescriptor::ConvertToMatrixForm
            ((SparseMatrix *)local_78,(SparseMatrix *)(filename.field_2._M_local_buf + 8),
             (SparseMatrix *)&matrCq.m_data.m_allocatedSize,(Matrix *)0x0,(Matrix *)0x0,
             (Matrix *)0x0,false,false);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8,
                 out_dir,"/dump_M_1.dat");
  uVar7 = std::__cxx11::string::c_str();
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile(local_8e8,uVar7,0x20);
  std::operator+(&local_908,out_dir,"/dump_Cq_1.dat");
  std::__cxx11::string::operator=((string *)local_5f8,(string *)&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  uVar7 = std::__cxx11::string::c_str();
  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile((ChStreamOutAsciiFile *)&myex,uVar7,0x20);
  chrono::StreamOUTsparseMatlabFormat((ChSparseMatrix *)&matrCq.m_data.m_allocatedSize,local_618);
  chrono::StreamOUTsparseMatlabFormat((ChSparseMatrix *)((long)&filename.field_2 + 8),local_928);
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)&myex);
  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(local_8e8);
  std::__cxx11::string::~string((string *)local_5f8);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::StreamOUT((ChSparseMatrix *)&matrCq.m_data.m_allocatedSize,pCVar1);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::StreamOUT((ChSparseMatrix *)((long)&filename.field_2 + 8),pCVar1);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"**** Using ChSolverPSOR  ********** \n\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar1,"METRICS: max residual: ");
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,max_LCPerr);
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,"  max LCP error: ");
  pCVar1 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar1,(double)matrM.m_data.m_allocatedSize);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"  \n\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"vars q_a and q_b -------------------\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChVariables::Get_qb(&local_c18,(ChVariables *)local_f8);
  chrono::operator<<(pCVar1,&local_c18);
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChVariables::Get_qb(&local_c30,(ChVariables *)local_1a8);
  pCVar1 = chrono::operator<<(pCVar1,&local_c30);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"  \n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"multipliers l_1 and l_2 ------------\n\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  dVar8 = chrono::ChConstraint::Get_l_i((ChConstraint *)local_250);
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,dVar8);
  chrono::ChStreamOutAscii::operator<<(pCVar1," \n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  dVar8 = chrono::ChConstraint::Get_l_i((ChConstraint *)local_3a8);
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,dVar8);
  chrono::ChStreamOutAscii::operator<<(pCVar1," \n\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"constraint residuals c_1 and c_2 ---\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  dVar8 = chrono::ChConstraint::Get_c_i((ChConstraint *)local_250);
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,dVar8);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"  \n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  dVar8 = chrono::ChConstraint::Get_c_i((ChConstraint *)local_3a8);
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar1,dVar8);
  chrono::ChStreamOutAscii::operator<<(pCVar1,"  \n\n\n");
  chrono::ChVariables::Get_qb(&local_c48,(ChVariables *)local_f8);
  Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
  setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           *)&local_c48);
  chrono::ChVariables::Get_qb(&local_c60,(ChVariables *)local_1a8);
  Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
  setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           *)&local_c60);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix
            ((SparseMatrix<double,_1,_int> *)((long)&filename.field_2 + 8));
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix
            ((SparseMatrix<double,_1,_int> *)&matrCq.m_data.m_allocatedSize);
  chrono::ChSolverPSOR::~ChSolverPSOR((ChSolverPSOR *)&max_res);
  chrono::ChConstraintTwoGeneric::~ChConstraintTwoGeneric(local_3a8);
  chrono::ChConstraintTwoGeneric::~ChConstraintTwoGeneric(local_250);
  chrono::ChVariablesGeneric::~ChVariablesGeneric((ChVariablesGeneric *)local_1a8);
  chrono::ChVariablesGeneric::~ChVariablesGeneric((ChVariablesGeneric *)local_f8);
  chrono::ChSystemDescriptor::~ChSystemDescriptor(local_78);
  return;
}

Assistant:

void test_1(const std::string& out_dir) {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: generic system with two constraints \n\n";

    // Important: create a 'system descriptor' object that
    // contains variables and constraints:

    ChSystemDescriptor mdescriptor;

    // Now let's add variables and constraints, as sparse data:

    mdescriptor.BeginInsertion();  // ----- system description starts here

    // create C++ objects representing 'variables':

    ChVariablesGeneric mvarA(3);
    mvarA.GetMass().setIdentity();
    mvarA.GetMass() *= 10;
    mvarA.GetInvMass() = mvarA.GetMass().inverse();
    mvarA.Get_fb()(0) = 1;
    mvarA.Get_fb()(1) = 2;

    ChVariablesGeneric mvarB(3);
    mvarB.GetMass().setIdentity();
    mvarB.GetMass() *= 20;
    mvarB.GetInvMass() = mvarB.GetMass().inverse();

    mdescriptor.InsertVariables(&mvarA);
    mdescriptor.InsertVariables(&mvarB);

    // create C++ objects representing 'constraints' between variables:

    ChConstraintTwoGeneric mca(&mvarA, &mvarB);
    mca.Set_b_i(-5);
    mca.Get_Cq_a()(0) = 1;
    mca.Get_Cq_a()(1) = 2;
    mca.Get_Cq_a()(2) = -1;
    mca.Get_Cq_b()(0) = 1;
    mca.Get_Cq_b()(1) = -2;
    mca.Get_Cq_b()(2) = 0;

    ChConstraintTwoGeneric mcb(&mvarA, &mvarB);
    mcb.Set_b_i(1);
    mcb.Get_Cq_a()(0) = 0;
    mcb.Get_Cq_a()(1) = 1;
    mcb.Get_Cq_a()(2) = 0;
    mcb.Get_Cq_b()(0) = 0;
    mcb.Get_Cq_b()(1) = -2;
    mcb.Get_Cq_b()(2) = 0;

    mdescriptor.InsertConstraint(&mca);
    mdescriptor.InsertConstraint(&mcb);

    mdescriptor.EndInsertion();  // ----- system description ends here

    // Solve the problem with an iterative fixed-point solver, for an
    // approximate (but very fast) solution:
    
    // Create the solver...
    ChSolverPSOR solver;
    solver.SetMaxIterations(1);
    solver.EnableWarmStart(false);
    solver.SetTolerance(0.0);
    solver.SetOmega(0.8);

    // .. pass the constraint and the variables to the solver to solve
    solver.Setup(mdescriptor);
    solver.Solve(mdescriptor);

    // Ok, now present the result to the user, with some
    // statistical information:
    double max_res, max_LCPerr;
    mdescriptor.ComputeFeasabilityViolation(max_res, max_LCPerr);

    // If needed, dump the full system M and Cq matrices
    // on disk, in Matlab sparse format:
    ChSparseMatrix matrM;
    ChSparseMatrix matrCq;

    mdescriptor.ConvertToMatrixForm(&matrCq, &matrM, 0, 0, 0, 0, false, false);

    try {
        std::string filename = out_dir + "/dump_M_1.dat";
        ChStreamOutAsciiFile fileM(filename.c_str());
        filename = out_dir + "/dump_Cq_1.dat";
        ChStreamOutAsciiFile fileCq(filename.c_str());
        StreamOUTsparseMatlabFormat(matrM, fileM);
        StreamOUTsparseMatlabFormat(matrCq, fileCq);
    } catch (const ChException &myex) {
        GetLog() << "FILE ERROR: " << myex.what();
    }

    StreamOUT(matrM, GetLog());
    StreamOUT(matrCq, GetLog());

    GetLog() << "**** Using ChSolverPSOR  ********** \n\n";
    GetLog() << "METRICS: max residual: " << max_res << "  max LCP error: " << max_LCPerr << "  \n\n";
    GetLog() << "vars q_a and q_b -------------------\n";
    GetLog() << mvarA.Get_qb();
    GetLog() << mvarB.Get_qb() << "  \n";
    GetLog() << "multipliers l_1 and l_2 ------------\n\n";
    GetLog() << mca.Get_l_i() << " \n";
    GetLog() << mcb.Get_l_i() << " \n\n";
    GetLog() << "constraint residuals c_1 and c_2 ---\n";
    GetLog() << mca.Get_c_i() << "  \n";
    GetLog() << mcb.Get_c_i() << "  \n\n\n";

    // reset variables
    mvarA.Get_qb().setZero();
    mvarB.Get_qb().setZero();
}